

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O1

int Ssw_SecCexResimulate(Aig_Man_t *p,int *pModel,int *pnOutputs)

{
  undefined1 *puVar1;
  void *pvVar2;
  void **ppvVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  
  *pnOutputs = 0;
  puVar1 = &p->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x10;
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      *(ulong *)((long)pVVar5->pArray[lVar4] + 0x18) =
           *(ulong *)((long)pVVar5->pArray[lVar4] + 0x18) & 0xffffffffffffffef |
           (ulong)((pModel[lVar4] & 1U) << 4);
      lVar4 = lVar4 + 1;
      pVVar5 = p->vCis;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar4];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar2 + 0x18) =
             *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffef |
             (ulong)((((uint)*(ulong *)((long)pvVar2 + 0x10) ^
                      *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 4)
                      & ((uint)*(ulong *)((long)pvVar2 + 8) ^
                        *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18) >> 4)
                     & 1) << 4);
      }
      lVar4 = lVar4 + 1;
      pVVar5 = p->vObjs;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar4];
      *(ulong *)((long)pvVar2 + 0x18) =
           *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffef |
           (ulong)(((int)*(ulong *)((long)pvVar2 + 8) << 4 ^
                   *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x10);
      lVar4 = lVar4 + 1;
      pVVar5 = p->vCos;
    } while (lVar4 < pVVar5->nSize);
  }
  if (pVVar5->nSize < 1) {
    iVar6 = -1;
  }
  else {
    ppvVar3 = pVVar5->pArray;
    iVar6 = -1;
    lVar4 = 0;
    do {
      if ((*(byte *)((long)ppvVar3[lVar4] + 0x18) & 0x10) != 0) {
        if (iVar6 == -1) {
          iVar6 = (int)lVar4;
        }
        *pnOutputs = *pnOutputs + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar5->nSize);
  }
  Aig_ManCleanMarkA(p);
  return iVar6;
}

Assistant:

int Ssw_SecCexResimulate( Aig_Man_t * p, int * pModel, int * pnOutputs )
{
    Aig_Obj_t * pObj;
    int i, RetValue = -1;
    *pnOutputs = 0;
    Aig_ManConst1(p)->fMarkA = 1;
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkA = pModel[i];
    Aig_ManForEachNode( p, pObj, i )
        pObj->fMarkA = ( Aig_ObjFanin0(pObj)->fMarkA ^ Aig_ObjFaninC0(pObj) ) & 
                      ( Aig_ObjFanin1(pObj)->fMarkA ^ Aig_ObjFaninC1(pObj) );
    Aig_ManForEachCo( p, pObj, i )
        pObj->fMarkA = Aig_ObjFanin0(pObj)->fMarkA ^ Aig_ObjFaninC0(pObj);
    Aig_ManForEachCo( p, pObj, i )
        if ( pObj->fMarkA )
        {
            if ( RetValue == -1 )
                RetValue = i;
            (*pnOutputs)++;
        }
    Aig_ManCleanMarkA(p);
    return RetValue;
}